

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void PushStyleCompact(void)

{
  ImGuiStyle *pIVar1;
  ImVec2 local_18;
  
  pIVar1 = ImGui::GetStyle();
  local_18.y = (float)(int)((pIVar1->FramePadding).y * 0.6);
  local_18.x = (pIVar1->FramePadding).x;
  ImGui::PushStyleVar(0xb,&local_18);
  local_18.y = (float)(int)((pIVar1->ItemSpacing).y * 0.6);
  local_18.x = (pIVar1->ItemSpacing).x;
  ImGui::PushStyleVar(0xe,&local_18);
  return;
}

Assistant:

static void PushStyleCompact()
{
    ImGuiStyle& style = ImGui::GetStyle();
    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(style.FramePadding.x, (float)(int)(style.FramePadding.y * 0.60f)));
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x, (float)(int)(style.ItemSpacing.y * 0.60f)));
}